

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O2

void R_RenderFakeWall(drawseg_t *ds,int x1,int x2,F3DFloor *rover)

{
  undefined4 uVar1;
  undefined4 uVar2;
  side_t *psVar3;
  double dVar4;
  short *psVar5;
  ESPSResult EVar6;
  long lVar7;
  side_t **ppsVar8;
  lighttable_t *plVar9;
  long lVar10;
  short *psVar11;
  short *psVar12;
  float fVar13;
  double yrepeat;
  double dVar14;
  long lStackY_50;
  
  EVar6 = R_SetPatchStyle(LegacyRenderStyles[((rover->flags >> 0x1c & 1) != 0) + 6],
                          (fixed_t)(((long)rover->alpha << 0x10) / 0xff),0,0);
  if (EVar6 == DontDraw) goto LAB_003339a6;
  rw_lightstep = ds->lightstep;
  lVar7 = (long)ds->x1;
  fVar13 = (float)(x1 - ds->x1);
  rw_light = rw_lightstep * fVar13 + ds->light;
  mfloorclip = openings + (ds->sprbottomclip - lVar7);
  mceilingclip = openings + (ds->sprtopclip - lVar7);
  spryscale = (double)(fVar13 * ds->iscalestep + ds->iscale);
  rw_scalestep = (double)ds->iscalestep;
  MaskedSWall = (float *)(openings + ds->swall + lVar7 * -2);
  if ((rover->flags >> 0x11 & 1) == 0) {
    if ((rover->flags >> 0x12 & 1) == 0) {
      ppsVar8 = rover->master->sidedef;
      lStackY_50 = 1;
    }
    else {
      ppsVar8 = &curline->sidedef;
      lStackY_50 = 2;
    }
  }
  else {
    ppsVar8 = &curline->sidedef;
    lStackY_50 = 0;
  }
  dVar14 = (*ppsVar8)->textures[lStackY_50].xScale * (rw_pic->Scale).X;
  yrepeat = (*ppsVar8)->textures[lStackY_50].yScale * (rw_pic->Scale).Y;
  psVar3 = rover->master->sidedef[0];
  dVar4 = psVar3->textures[1].yOffset + curline->sidedef->textures[1].yOffset;
  rw_offset = SUB84(curline->sidedef->textures[1].xOffset + 103079215104.0 +
                    psVar3->textures[1].xOffset,0);
  if (dVar4 < 0.0) {
    dVar4 = dVar4 + (double)rw_pic->Height;
  }
  if ((rw_pic->field_0x31 & 4) != 0) {
    dVar4 = dVar4 * yrepeat;
    rw_offset = SUB84((double)rw_offset * dVar14 + 6755399441055744.0,0);
  }
  dc_texturemid = (rover->model->planes[1].TexZ - ViewPos.Z) * yrepeat + dVar4;
  if ((long)fixedlightlev < 0) {
    plVar9 = fixedcolormap;
    if (fixedcolormap != (lighttable_t *)0x0) goto LAB_00333844;
  }
  else {
    plVar9 = basecolormap->Maps + fixedlightlev;
LAB_00333844:
    dc_colormap = plVar9;
  }
  WallC.sz1 = ds->sz1;
  WallC.sz2 = ds->sz2;
  WallC.sx1 = ds->sx1;
  WallC.sx2 = ds->sx2;
  WallC.tleft.X = ds->cx;
  WallC.tleft.Y = ds->cy;
  uVar1 = ds->cdx;
  uVar2 = ds->cdy;
  WallC.tright.X = (float)uVar1 + WallC.tleft.X;
  WallC.tright.Y = (float)uVar2 + WallC.tleft.Y;
  WallT.UoverZorg = (ds->tmapvals).UoverZorg;
  WallT.UoverZstep = (ds->tmapvals).UoverZstep;
  WallT.InvZorg = (ds->tmapvals).InvZorg;
  WallT.InvZstep = (ds->tmapvals).InvZstep;
  OWallMost(wallupper,sclipTop - ViewPos.Z,&WallC);
  OWallMost(walllower,sclipBottom - ViewPos.Z,&WallC);
  psVar12 = mceilingclip;
  lVar10 = (long)x1;
  psVar11 = wallupper + lVar10;
  for (lVar7 = lVar10; psVar5 = mfloorclip, lVar7 < x2; lVar7 = lVar7 + 1) {
    if (*psVar11 < psVar12[lVar7]) {
      *psVar11 = psVar12[lVar7];
    }
    psVar11 = psVar11 + 1;
  }
  psVar12 = walllower + lVar10;
  for (; lVar10 < x2; lVar10 = lVar10 + 1) {
    if (psVar5[lVar10] < *psVar12) {
      *psVar12 = psVar5[lVar10];
    }
    psVar12 = psVar12 + 1;
  }
  PrepLWall(lwall,dVar14 * (double)curline->sidedef->TexelLength,(int)ds->sx1,(int)ds->sx2);
  wallscan_np2_ds(ds,x1,x2,wallupper,walllower,MaskedSWall,lwall,yrepeat);
LAB_003339a6:
  R_FinishSetPatchStyle();
  return;
}

Assistant:

void R_RenderFakeWall(drawseg_t *ds, int x1, int x2, F3DFloor *rover)
{
	int i;
	double xscale;
	double yscale;

	fixed_t Alpha = Scale(rover->alpha, OPAQUE, 255);
	ESPSResult drawmode;
	drawmode = R_SetPatchStyle (LegacyRenderStyles[rover->flags & FF_ADDITIVETRANS ? STYLE_Add : STYLE_Translucent],
		Alpha, 0, 0);

	if(drawmode == DontDraw) {
		R_FinishSetPatchStyle();
		return;
	}

	rw_lightstep = ds->lightstep;
	rw_light = ds->light + (x1 - ds->x1) * rw_lightstep;

	mfloorclip = openings + ds->sprbottomclip - ds->x1;
	mceilingclip = openings + ds->sprtopclip - ds->x1;

	spryscale = ds->iscale + ds->iscalestep * (x1 - ds->x1);
	rw_scalestep = ds->iscalestep;
	MaskedSWall = (float *)(openings + ds->swall) - ds->x1;

	// find positioning
	side_t *scaledside;
	side_t::ETexpart scaledpart;
	if (rover->flags & FF_UPPERTEXTURE)
	{
		scaledside = curline->sidedef;
		scaledpart = side_t::top;
	}
	else if (rover->flags & FF_LOWERTEXTURE)
	{
		scaledside = curline->sidedef;
		scaledpart = side_t::bottom;
	}
	else
	{
		scaledside = rover->master->sidedef[0];
		scaledpart = side_t::mid;
	}
	xscale = rw_pic->Scale.X * scaledside->GetTextureXScale(scaledpart);
	yscale = rw_pic->Scale.Y * scaledside->GetTextureYScale(scaledpart);

	double rowoffset = curline->sidedef->GetTextureYOffset(side_t::mid) + rover->master->sidedef[0]->GetTextureYOffset(side_t::mid);
	double planez = rover->model->GetPlaneTexZ(sector_t::ceiling);
	rw_offset = FLOAT2FIXED(curline->sidedef->GetTextureXOffset(side_t::mid) + rover->master->sidedef[0]->GetTextureXOffset(side_t::mid));
	if (rowoffset < 0)
	{
		rowoffset += rw_pic->GetHeight();
	}
	dc_texturemid = (planez - ViewPos.Z) * yscale;
	if (rw_pic->bWorldPanning)
	{
		// rowoffset is added before the multiply so that the masked texture will
		// still be positioned in world units rather than texels.

		dc_texturemid = dc_texturemid + rowoffset * yscale;
		rw_offset = xs_RoundToInt(rw_offset * xscale);
	}
	else
	{
		// rowoffset is added outside the multiply so that it positions the texture
		// by texels instead of world units.
		dc_texturemid += rowoffset;
	}

	if (fixedlightlev >= 0)
		dc_colormap = basecolormap->Maps + fixedlightlev;
	else if (fixedcolormap != NULL)
		dc_colormap = fixedcolormap;

	WallC.sz1 = ds->sz1;
	WallC.sz2 = ds->sz2;
	WallC.sx1 = ds->sx1;
	WallC.sx2 = ds->sx2;
	WallC.tleft.X = ds->cx;
	WallC.tleft.Y = ds->cy;
	WallC.tright.X = ds->cx + ds->cdx;
	WallC.tright.Y = ds->cy + ds->cdy;
	WallT = ds->tmapvals;

	OWallMost(wallupper, sclipTop - ViewPos.Z, &WallC);
	OWallMost(walllower, sclipBottom - ViewPos.Z, &WallC);

	for (i = x1; i < x2; i++)
	{
		if (wallupper[i] < mceilingclip[i])
			wallupper[i] = mceilingclip[i];
	}
	for (i = x1; i < x2; i++)
	{
		if (walllower[i] > mfloorclip[i])
			walllower[i] = mfloorclip[i];
	}

	PrepLWall (lwall, curline->sidedef->TexelLength*xscale, ds->sx1, ds->sx2);
	wallscan_np2_ds(ds, x1, x2, wallupper, walllower, MaskedSWall, lwall, yscale);
	R_FinishSetPatchStyle();
}